

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp.hpp
# Opt level: O3

agent_queue_t * __thiscall
so_5::disp::thread_pool::impl::work_thread_details::
work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>
::pop_agent_queue(work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>
                  *this)

{
  pointer *pppcVar1;
  mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t> *this_00;
  condition_t *pcVar2;
  _Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false> _Var3;
  _Elt_pointer ppaVar4;
  iterator __position;
  condition_t *in_RAX;
  agent_queue_t *paVar5;
  condition_t *local_38;
  
  this_00 = *(mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t> **)this;
  pcVar2 = *(condition_t **)(this + 0x18);
  _Var3._M_head_impl =
       (this_00->m_lock)._M_t.
       super___uniq_ptr_impl<so_5::disp::mpmc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
       .super__Head_base<0UL,_so_5::disp::mpmc_queue_traits::lock_t_*,_false>._M_head_impl;
  local_38 = in_RAX;
  (*(_Var3._M_head_impl)->_vptr_lock_t[2])(_Var3._M_head_impl);
  if (this_00->m_shutdown == false) {
    paVar5 = (agent_queue_t *)0x0;
    do {
      ppaVar4 = (this_00->m_queue).
                super__Deque_base<so_5::disp::thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::thread_pool::impl::agent_queue_t_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this_00->m_queue).
          super__Deque_base<so_5::disp::thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::thread_pool::impl::agent_queue_t_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppaVar4) {
        paVar5 = *ppaVar4;
        std::
        deque<so_5::disp::thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::thread_pool::impl::agent_queue_t_*>_>
        ::pop_front(&this_00->m_queue);
        reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>::
        try_wakeup_someone_if_possible(this_00);
        break;
      }
      __position._M_current =
           (this_00->m_waiting_customers).
           super__Vector_base<so_5::disp::mpmc_queue_traits::condition_t_*,_std::allocator<so_5::disp::mpmc_queue_traits::condition_t_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = pcVar2;
      if (__position._M_current ==
          (this_00->m_waiting_customers).
          super__Vector_base<so_5::disp::mpmc_queue_traits::condition_t_*,_std::allocator<so_5::disp::mpmc_queue_traits::condition_t_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<so_5::disp::mpmc_queue_traits::condition_t*,std::allocator<so_5::disp::mpmc_queue_traits::condition_t*>>
        ::_M_realloc_insert<so_5::disp::mpmc_queue_traits::condition_t*>
                  ((vector<so_5::disp::mpmc_queue_traits::condition_t*,std::allocator<so_5::disp::mpmc_queue_traits::condition_t*>>
                    *)&this_00->m_waiting_customers,__position,&local_38);
      }
      else {
        *__position._M_current = pcVar2;
        pppcVar1 = &(this_00->m_waiting_customers).
                    super__Vector_base<so_5::disp::mpmc_queue_traits::condition_t_*,_std::allocator<so_5::disp::mpmc_queue_traits::condition_t_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      (*pcVar2->_vptr_condition_t[2])(pcVar2);
      this_00->m_wakeup_in_progress = false;
    } while (this_00->m_shutdown == false);
  }
  else {
    paVar5 = (agent_queue_t *)0x0;
  }
  (*(_Var3._M_head_impl)->_vptr_lock_t[3])(_Var3._M_head_impl);
  return paVar5;
}

Assistant:

agent_queue_t *
		pop_agent_queue() SO_5_NOEXCEPT
			{
				agent_queue_t * result = nullptr;

				this->wait_started();

				result = this->m_disp_queue->pop( *(this->m_condition) );

				this->wait_finished();

				return result;
			}